

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

void __thiscall sector_t::TransferSpecial(sector_t *this,sector_t *model)

{
  sector_t *model_local;
  sector_t *this_local;
  
  this->special = model->special;
  this->damageamount = model->damageamount;
  FNameNoInit::operator=(&this->damagetype,&model->damagetype);
  this->damageinterval = model->damageinterval;
  this->leakydamage = model->leakydamage;
  this->Flags = this->Flags & 0xfffff84f | model->Flags & 0x7b0;
  return;
}

Assistant:

void sector_t::TransferSpecial(sector_t *model)
{
	special = model->special;
	damageamount = model->damageamount;
	damagetype = model->damagetype;
	damageinterval = model->damageinterval;
	leakydamage = model->leakydamage;
	Flags = (Flags&~SECF_SPECIALFLAGS) | (model->Flags & SECF_SPECIALFLAGS);
}